

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen.h
# Opt level: O0

void __thiscall absl::lts_20240722::random_internal::Randen::Generate(Randen *this,void *state)

{
  void *state_local;
  Randen *this_local;
  
  if (((byte)this[8] & 1) == 0) {
    absl::lts_20240722::random_internal::RandenSlow::Generate(*(void **)this,state);
  }
  else {
    absl::lts_20240722::random_internal::RandenHwAes::Generate(*(void **)this,state);
  }
  return;
}

Assistant:

inline void Generate(void* state) const {
#if ABSL_RANDOM_INTERNAL_AES_DISPATCH
    // HW AES Dispatch.
    if (has_crypto_) {
      RandenHwAes::Generate(keys_, state);
    } else {
      RandenSlow::Generate(keys_, state);
    }
#elif ABSL_HAVE_ACCELERATED_AES
    // HW AES is enabled.
    RandenHwAes::Generate(keys_, state);
#else
    // HW AES is disabled.
    RandenSlow::Generate(keys_, state);
#endif
  }